

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

int __thiscall Path::rename(Path *this,char *__old,char *__new)

{
  Type TVar1;
  int iVar2;
  undefined8 uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Log LStack_b8;
  Log local_a8;
  Log local_98;
  undefined1 local_88 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  char local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  Log local_38;
  Log local_28;
  
  TVar1 = type(this);
  if ((TVar1 == File) || (TVar1 = type(this), TVar1 == Directory)) {
    iVar2 = ::rename((this->super_String).mString._M_dataplus._M_p,*(char **)__old);
    if (iVar2 == 0) {
      uVar3 = std::__cxx11::string::_M_assign((string *)this);
      return (int)CONCAT71((int7)((ulong)uVar3 >> 8),1);
    }
    error();
    Log::operator<<((Log *)local_88,local_48);
    operator<<(&local_98,(String *)local_88);
    Log::operator<<((Log *)(local_88 + 0x10),(char *)&local_98);
    operator<<(&LStack_b8,(String *)(local_88 + 0x10));
    Log::operator<<(&local_a8,(char *)&LStack_b8);
    __errno_location();
    Log::addStringStream<int>(&local_38,(int)&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&LStack_b8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    this_00 = &local_40;
  }
  else {
    error();
    Log::operator<<((Log *)local_68,(char *)&local_98);
    operator<<(&LStack_b8,(String *)local_68);
    Log::operator<<((Log *)(local_68 + 0x10),(char *)&LStack_b8);
    operator<<(&local_a8,(String *)(local_68 + 0x10));
    Log::operator<<(&local_28,(char *)&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&LStack_b8.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    this_00 = &local_98.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return 0;
}

Assistant:

bool Path::rename(const Path &f_newName)
{
    if(type() != File && type() != Directory)
    {
        error() << "Can't rename " << *this << " to " << f_newName
                << ": Not a file or directory.";
        return false;
    }

#ifdef _WIN32
    if(f_newName.exists())
    {
        // on windows, rename() fails if the target exists.
        f_newName.rm();
    }

    int result = _wrename(Utf8To16(c_str()).asWchar_t(),
                          Utf8To16(f_newName.c_str()).asWchar_t());
#else
    int result = ::rename(c_str(), f_newName.c_str());
#endif

    if(result != 0)
    {
        error() << "Can't rename " << *this << " to " << f_newName
                << ": errno=" << errno;
        return false;
    }

    // rename was successful
    *this = f_newName;

    return true;
}